

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O2

void duckdb::ArrowVarcharToStringViewData::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  undefined4 uVar1;
  data_ptr_t pdVar2;
  ArrowBuffer *pAVar3;
  ArrowBuffer *pAVar4;
  data_ptr_t data;
  ulong uVar5;
  idx_t iVar6;
  data_ptr_t pdVar7;
  uint length;
  void *__src;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined8 local_c0;
  void *pvStack_b8;
  data_ptr_t local_b0;
  ArrowBuffer *local_a8;
  idx_t local_a0;
  long local_98;
  data_ptr_t local_90;
  ArrowBuffer *local_88;
  long local_80;
  UnifiedVectorFormat format;
  
  local_a0 = to;
  UnifiedVectorFormat::UnifiedVectorFormat(&format);
  Vector::ToUnifiedFormat(input,input_size,&format);
  local_a8 = ArrowAppendData::GetMainBuffer(append_data);
  pAVar3 = ArrowAppendData::GetValidityBuffer(append_data);
  pAVar4 = ArrowAppendData::GetAuxBuffer(append_data);
  lVar9 = local_a0 - from;
  ResizeValidity(pAVar3,append_data->row_count + lVar9);
  local_90 = pAVar3->dataptr;
  ArrowBuffer::resize(local_a8,lVar9 * 0x10 + local_a8->count);
  local_80 = from * 4;
  lVar8 = 0;
  local_b0 = format.data;
  pdVar7 = format.data;
  local_98 = lVar9;
  local_88 = pAVar4;
  while( true ) {
    pAVar3 = local_88;
    uVar5 = from + lVar8;
    if (local_a0 <= uVar5) break;
    if ((format.sel)->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)*(uint *)((long)(format.sel)->sel_vector + lVar8 * 4 + local_80);
    }
    uVar10 = append_data->row_count + lVar8;
    pdVar2 = local_a8->dataptr;
    if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
         (uVar5 & 0x3f) & 1) != 0)) {
      lVar9 = uVar5 * 0x10;
      length = (uint)*(ulong *)(pdVar7 + lVar9);
      if (length < 0xd) {
        data = pdVar7 + lVar9 + 4;
      }
      else {
        data = *(data_ptr_t *)(pdVar7 + lVar9 + 8);
      }
      uVar5 = *(ulong *)(pdVar7 + lVar9) & 0xffffffff;
      if (uVar5 < 0xd) {
        arrow_string_view_t::arrow_string_view_t
                  ((arrow_string_view_t *)&local_c0,length,(char *)data);
        *(ulong *)(pdVar2 + uVar10 * 0x10) = local_c0;
        *(void **)((long)(pdVar2 + uVar10 * 0x10) + 8) = pvStack_b8;
        pdVar7 = local_b0;
      }
      else {
        iVar6 = append_data->offset;
        uVar1 = *(undefined4 *)data;
        lVar11 = uVar10 * 0x10;
        *(uint *)(pdVar2 + lVar11) = length;
        *(undefined4 *)(pdVar2 + lVar11 + 4) = uVar1;
        pdVar7 = pdVar2 + lVar11 + 8;
        pdVar7[0] = '\0';
        pdVar7[1] = '\0';
        pdVar7[2] = '\0';
        pdVar7[3] = '\0';
        *(int *)(pdVar2 + lVar11 + 0xc) = (int)iVar6;
        iVar6 = uVar5 + append_data->offset;
        ArrowBuffer::resize(local_88,iVar6);
        pdVar7 = local_b0;
        local_c0 = *(ulong *)(local_b0 + lVar9);
        pvStack_b8 = *(void **)((long)(local_b0 + lVar9) + 8);
        __src = pvStack_b8;
        if ((uint)local_c0 < 0xd) {
          __src = (void *)((long)&local_c0 + 4);
        }
        switchD_016b0717::default(pAVar3->dataptr + append_data->offset,__src,local_c0 & 0xffffffff)
        ;
        append_data->offset = iVar6;
      }
    }
    else {
      local_90[uVar10 >> 3] = local_90[uVar10 >> 3] & ~(byte)(1L << ((byte)uVar10 & 7));
      append_data->null_count = append_data->null_count + 1;
      arrow_string_view_t::arrow_string_view_t
                ((arrow_string_view_t *)&local_c0,0,anon_var_dwarf_3b2a81b + 9);
      *(ulong *)(pdVar2 + uVar10 * 0x10) = local_c0;
      *(void **)((long)(pdVar2 + uVar10 * 0x10) + 8) = pvStack_b8;
    }
    lVar8 = lVar8 + 1;
  }
  append_data->row_count = append_data->row_count + local_98;
  UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		idx_t size = to - from;
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &validity_buffer = append_data.GetValidityBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();
		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(validity_buffer, append_data.row_count + size);
		auto validity_data = (uint8_t *)validity_buffer.data();

		main_buffer.resize(main_buffer.size() + sizeof(arrow_string_view_t) * (size));
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		auto data = UnifiedVectorFormat::GetData<string_t>(format);
		for (idx_t i = from; i < to; i++) {
			auto result_idx = append_data.row_count + i - from;
			auto arrow_data = main_buffer.GetData<arrow_string_view_t>();
			auto source_idx = format.sel->get_index(i);
			if (!format.validity.RowIsValid(source_idx)) {
				// Null value
				uint8_t current_bit;
				idx_t current_byte;
				GetBitPosition(result_idx, current_byte, current_bit);
				SetNull(append_data, validity_data, current_byte, current_bit);
				// We have to set these bytes to 0, for some reason
				arrow_data[result_idx] = arrow_string_view_t(0, "");
				continue;
			}
			// These two are now the same buffer
			idx_t string_length = ArrowVarcharConverter::GetLength(data[source_idx]);
			auto string_data = data[source_idx].GetData();
			if (string_length <= ArrowStringViewConstants::MAX_INLINED_BYTES) {
				//	This string is inlined
				//  | Bytes 0-3  | Bytes 4-15                            |
				//  |------------|---------------------------------------|
				//  | length     | data (padded with 0)                  |
				arrow_data[result_idx] = arrow_string_view_t(UnsafeNumericCast<int32_t>(string_length), string_data);
			} else {
				// This string is not inlined, we have to check a different buffer and offsets
				//  | Bytes 0-3  | Bytes 4-7  | Bytes 8-11 | Bytes 12-15 |
				//  |------------|------------|------------|-------------|
				//  | length     | prefix     | buf. index | offset      |
				arrow_data[result_idx] = arrow_string_view_t(UnsafeNumericCast<int32_t>(string_length), string_data, 0,
				                                             UnsafeNumericCast<int32_t>(append_data.offset));
				auto current_offset = append_data.offset + string_length;
				aux_buffer.resize(current_offset);
				ArrowVarcharConverter::WriteData(aux_buffer.data() + append_data.offset, data[source_idx]);
				append_data.offset = current_offset;
			}
		}
		append_data.row_count += size;
	}